

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

string * anon_unknown.dwarf_bb7cf9::IndentText
                   (string *__return_storage_ptr__,string *text,cmMakefile *mf)

{
  bool bVar1;
  string *psVar2;
  cmake *pcVar3;
  string_view arg;
  string_view arg_00;
  string_view separator;
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  string context;
  string indent;
  string local_50;
  static_string_view local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CMAKE_MESSAGE_INDENT",(allocator<char> *)&context);
  psVar2 = cmMakefile::GetSafeDefinition(mf,(string *)&local_f0);
  arg._M_str = (psVar2->_M_dataplus)._M_p;
  arg._M_len = psVar2->_M_string_length;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,arg,false);
  cmJoin(&indent,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_c0,(string_view)(ZEXT816(0x61ebb9) << 0x40),(string_view)ZEXT816(0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  pcVar3 = cmMakefile::GetCMakeInstance(mf);
  if (pcVar3->LogContext == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CMAKE_MESSAGE_CONTEXT_SHOW",(allocator<char> *)&local_c0);
    bVar1 = cmMakefile::IsOn(mf,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (!bVar1) goto LAB_002c00d0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CMAKE_MESSAGE_CONTEXT",(allocator<char> *)&local_50);
  psVar2 = cmMakefile::GetSafeDefinition(mf,(string *)&local_f0);
  arg_00._M_str = (psVar2->_M_dataplus)._M_p;
  arg_00._M_len = psVar2->_M_string_length;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,arg_00,false);
  separator._M_str = ".";
  separator._M_len = 1;
  cmJoin(&context,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c0,separator,(string_view)ZEXT816(0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (context._M_string_length != 0) {
    local_f0.View_._M_len = 1;
    local_f0.View_._M_str = "[";
    local_c0.View_._M_len = context._M_string_length;
    local_c0.View_._M_str = context._M_dataplus._M_p;
    local_30.super_string_view._M_len = 2;
    local_30.super_string_view._M_str = "] ";
    cmStrCat<cm::static_string_view>(&local_50,&local_f0,&local_c0,&local_30);
    std::__cxx11::string::insert((ulong)&indent,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&context);
LAB_002c00d0:
  if (indent._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"\n",(allocator<char> *)&context);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                   "\n",&indent);
    cmsys::SystemTools::ReplaceString(text,(string *)&local_f0,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::insert((ulong)text,(string *)0x0);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  std::__cxx11::string::~string((string *)&indent);
  return __return_storage_ptr__;
}

Assistant:

std::string IndentText(std::string text, cmMakefile& mf)
{
  auto indent =
    cmJoin(cmExpandedList(mf.GetSafeDefinition("CMAKE_MESSAGE_INDENT")), "");

  const auto showContext = mf.GetCMakeInstance()->GetShowLogContext() ||
    mf.IsOn("CMAKE_MESSAGE_CONTEXT_SHOW");
  if (showContext) {
    auto context = cmJoin(
      cmExpandedList(mf.GetSafeDefinition("CMAKE_MESSAGE_CONTEXT")), ".");
    if (!context.empty()) {
      indent.insert(0u, cmStrCat("["_s, context, "] "_s));
    }
  }

  if (!indent.empty()) {
    cmSystemTools::ReplaceString(text, "\n", "\n" + indent);
    text.insert(0u, indent);
  }
  return text;
}